

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextBuildNodesFromSettings
               (ImGuiContext *ctx,ImGuiDockNodeSettings *node_settings_array,int node_settings_count
               )

{
  ImGuiDockNode *node_00;
  char *name;
  ImGuiWindow *pIVar1;
  ImGuiDockNode *local_78;
  ImGuiDockNode *root_node;
  char host_window_title [20];
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImGuiDockNode *local_30;
  ImGuiDockNode *node;
  ImGuiDockNodeSettings *settings;
  int node_n;
  int node_settings_count_local;
  ImGuiDockNodeSettings *node_settings_array_local;
  ImGuiContext *ctx_local;
  
  settings._4_4_ = node_settings_count;
  _node_n = node_settings_array;
  node_settings_array_local = (ImGuiDockNodeSettings *)ctx;
  for (settings._0_4_ = 0; (int)settings < settings._4_4_; settings._0_4_ = (int)settings + 1) {
    node = (ImGuiDockNode *)(_node_n + (int)settings);
    if (node->ID != 0) {
      local_30 = DockContextAddNode((ImGuiContext *)node_settings_array_local,node->ID);
      if (node->SharedFlags == 0) {
        local_78 = (ImGuiDockNode *)0x0;
      }
      else {
        local_78 = DockContextFindNodeByID
                             ((ImGuiContext *)node_settings_array_local,node->SharedFlags);
      }
      local_30->ParentNode = local_78;
      ImVec2::ImVec2(&local_38,(float)(int)*(short *)&node->ParentNode,
                     (float)(int)*(short *)((long)&node->ParentNode + 2));
      local_30->Pos = local_38;
      ImVec2::ImVec2(&local_40,(float)(int)*(short *)((long)&node->ParentNode + 4),
                     (float)(int)*(short *)((long)&node->ParentNode + 6));
      local_30->Size = local_40;
      ImVec2::ImVec2(&local_48,(float)(int)*(short *)node->ChildNodes,
                     (float)(int)*(short *)((long)node->ChildNodes + 2));
      local_30->SizeRef = local_48;
      *(ushort *)&local_30->field_0xbc = *(ushort *)&local_30->field_0xbc & 0xfe3f | 0x40;
      *(ushort *)&local_30->field_0xbc = *(ushort *)&local_30->field_0xbc & 0xffc7 | 8;
      *(ushort *)&local_30->field_0xbc = *(ushort *)&local_30->field_0xbc & 0xfff8 | 1;
      if ((local_30->ParentNode == (ImGuiDockNode *)0x0) ||
         (local_30->ParentNode->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
        if ((local_30->ParentNode != (ImGuiDockNode *)0x0) &&
           (local_30->ParentNode->ChildNodes[1] == (ImGuiDockNode *)0x0)) {
          local_30->ParentNode->ChildNodes[1] = local_30;
        }
      }
      else {
        local_30->ParentNode->ChildNodes[0] = local_30;
      }
      local_30->SelectedTabId = node->LocalFlagsInWindows;
      local_30->SplitAxis = (int)(char)node->MergedFlags;
      ImGuiDockNode::SetLocalFlags(local_30,node->State & 0xc1fc20);
      node_00 = DockNodeGetRootNode(local_30);
      name = DockNodeGetHostWindowTitle(node_00,(char *)&root_node,0x14);
      pIVar1 = FindWindowByName(name);
      local_30->HostWindow = pIVar1;
    }
  }
  return;
}

Assistant:

static void ImGui::DockContextBuildNodesFromSettings(ImGuiContext* ctx, ImGuiDockNodeSettings* node_settings_array, int node_settings_count)
{
    // Build nodes
    for (int node_n = 0; node_n < node_settings_count; node_n++)
    {
        ImGuiDockNodeSettings* settings = &node_settings_array[node_n];
        if (settings->ID == 0)
            continue;
        ImGuiDockNode* node = DockContextAddNode(ctx, settings->ID);
        node->ParentNode = settings->ParentNodeId ? DockContextFindNodeByID(ctx, settings->ParentNodeId) : NULL;
        node->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
        node->Size = ImVec2(settings->Size.x, settings->Size.y);
        node->SizeRef = ImVec2(settings->SizeRef.x, settings->SizeRef.y);
        node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_DockNode;
        if (node->ParentNode && node->ParentNode->ChildNodes[0] == NULL)
            node->ParentNode->ChildNodes[0] = node;
        else if (node->ParentNode && node->ParentNode->ChildNodes[1] == NULL)
            node->ParentNode->ChildNodes[1] = node;
        node->SelectedTabId = settings->SelectedTabId;
        node->SplitAxis = (ImGuiAxis)settings->SplitAxis;
        node->SetLocalFlags(settings->Flags & ImGuiDockNodeFlags_SavedFlagsMask_);

        // Bind host window immediately if it already exist (in case of a rebuild)
        // This is useful as the RootWindowForTitleBarHighlight links necessary to highlight the currently focused node requires node->HostWindow to be set.
        char host_window_title[20];
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        node->HostWindow = FindWindowByName(DockNodeGetHostWindowTitle(root_node, host_window_title, IM_ARRAYSIZE(host_window_title)));
    }
}